

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SAXParseException::SAXParseException(SAXParseException *this,SAXParseException *toCopy)

{
  XMLFileLoc XVar1;
  XMLCh *pXVar2;
  
  SAXException::SAXException(&this->super_SAXException,&toCopy->super_SAXException);
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXParseException_00404bf0;
  XVar1 = toCopy->fLineNumber;
  this->fColumnNumber = toCopy->fColumnNumber;
  this->fLineNumber = XVar1;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  pXVar2 = XMLString::replicate(toCopy->fPublicId,(toCopy->super_SAXException).fMemoryManager);
  this->fPublicId = pXVar2;
  pXVar2 = XMLString::replicate(toCopy->fSystemId,(toCopy->super_SAXException).fMemoryManager);
  this->fSystemId = pXVar2;
  return;
}

Assistant:

SAXParseException::SAXParseException(const SAXParseException& toCopy) :

    SAXException(toCopy)
    , fColumnNumber(toCopy.fColumnNumber)
    , fLineNumber(toCopy.fLineNumber)
    , fPublicId(0)
    , fSystemId(0)
{
    fPublicId = XMLString::replicate(toCopy.fPublicId, toCopy.fMemoryManager);
    fSystemId = XMLString::replicate(toCopy.fSystemId, toCopy.fMemoryManager);
}